

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O3

void Bdc_SpfdDecomposeTest3(void)

{
  word *pwVar1;
  word *pwVar2;
  uint uVar3;
  uint uVar4;
  Vec_Wrd_t *p;
  word *pwVar5;
  word wVar6;
  Vec_Wrd_t *p_00;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  timespec ts;
  timespec local_38;
  
  Aig_ManRandom64(1);
  p = (Vec_Wrd_t *)malloc(0x10);
  p->nCap = 0x4000000;
  p->nSize = 0;
  pwVar5 = (word *)malloc(0x20000000);
  p->pArray = pwVar5;
  iVar10 = 0x4000000;
  do {
    wVar6 = Aig_ManRandom64(0);
    Vec_WrdPush(p,wVar6);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  p_00 = (Vec_Wrd_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  pwVar5 = (word *)malloc(0x80);
  p_00->pArray = pwVar5;
  iVar10 = 8;
  do {
    wVar6 = Aig_ManRandom64(0);
    Vec_WrdPush(p_00,wVar6);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  iVar10 = clock_gettime(3,&local_38);
  if (iVar10 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  pwVar5 = p->pArray;
  pwVar2 = p_00->pArray;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      lVar8 = lVar8 + 2;
    } while (lVar8 != 8);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x4000000);
  printf("Total = %8d.  ");
  iVar11 = 3;
  iVar10 = clock_gettime(3,&local_38);
  if (iVar10 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  iVar12 = 0;
  Abc_Print(iVar11,"%s =","Time");
  Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar7 + lVar9) / 1000000.0);
  iVar10 = clock_gettime(3,&local_38);
  if (iVar10 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  lVar7 = 0;
  do {
    iVar10 = 0;
    uVar3 = (uint)pwVar2[lVar7];
    uVar4 = *(uint *)((long)(pwVar2 + lVar7) + 4);
    lVar8 = 0;
    do {
      pwVar1 = pwVar5 + lVar8;
      auVar13._0_4_ = -(uint)(((uint)*pwVar1 & uVar3) == uVar3);
      auVar13._8_4_ = -(uint)(((uint)pwVar1[1] & uVar3) == uVar3);
      auVar13._12_4_ = -(uint)((*(uint *)((long)pwVar1 + 0xc) & uVar4) == uVar4);
      auVar14._4_4_ = auVar13._12_4_;
      auVar14._0_4_ = -(uint)((*(uint *)((long)pwVar1 + 4) & uVar4) == uVar4);
      auVar14._8_4_ = auVar13._12_4_;
      auVar14._12_4_ = auVar13._8_4_;
      auVar13._4_4_ = auVar13._8_4_;
      iVar12 = iVar12 - SUB164(auVar13 & auVar14,0);
      iVar10 = iVar10 - SUB164(auVar13 & auVar14,4);
      lVar8 = lVar8 + 2;
    } while (lVar8 != 0x4000000);
    iVar12 = iVar10 + iVar12;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  printf("Total = %8d.  ",iVar12);
  iVar11 = 3;
  iVar10 = clock_gettime(3,&local_38);
  if (iVar10 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Abc_Print(iVar11,"%s =","Time");
  Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar7 + lVar9) / 1000000.0);
  return;
}

Assistant:

void Bdc_SpfdDecomposeTest3()
{
    int nSizeM = (1 << 26);
    int nSizeK = (1 << 3);
    Vec_Wrd_t * v1M;
    Vec_Wrd_t * v1K;
    int i, k, Counter;
    abctime clk;
//    int EntryM, EntryK;
    Aig_ManRandom64( 1 );

    v1M = Vec_WrdAlloc( nSizeM );
    for ( i = 0; i < nSizeM; i++ )
        Vec_WrdPush( v1M, Aig_ManRandom64(0) );

    v1K = Vec_WrdAlloc( nSizeK );
    for ( i = 0; i < nSizeK; i++ )
        Vec_WrdPush( v1K, Aig_ManRandom64(0) );

    clk = Abc_Clock();
    Counter = 0;
    for ( i = 0; i < nSizeM; i++ )
    for ( k = 0; k < nSizeK; k++ )
        Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
//    Vec_WrdForEachEntry( v1M, EntryM, i )
//    Vec_WrdForEachEntry( v1K, EntryK, k )
//        Counter += ((EntryM & EntryK) == EntryK);

    printf( "Total = %8d.  ", Counter );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    Counter = 0;
    for ( k = 0; k < nSizeK; k++ )
    for ( i = 0; i < nSizeM; i++ )
        Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
    printf( "Total = %8d.  ", Counter );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

}